

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_module * lys_get_import_module_ns(lys_module *module,char *ns)

{
  long lVar1;
  int iVar2;
  lys_node **pplVar3;
  ulong uVar4;
  long lVar5;
  
  if ((module == (lys_module *)0x0) || (ns == (char *)0x0)) {
    __assert_fail("module && ns",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x9c6,
                  "const struct lys_module *lys_get_import_module_ns(const struct lys_module *, const char *)"
                 );
  }
  if ((module->field_0x40 & 1) == 0) {
    iVar2 = ly_strequal_(module->ns,ns);
    if (iVar2 != 0) {
      return module;
    }
  }
  else {
    iVar2 = ly_strequal_((char *)module->data[1].parent,ns);
    if (iVar2 != 0) {
      pplVar3 = &module->data;
      goto LAB_00151d9c;
    }
  }
  uVar4 = 0xffffffffffffffff;
  lVar1 = -0x38;
  do {
    lVar5 = lVar1;
    uVar4 = uVar4 + 1;
    if (module->imp_size <= uVar4) {
      return (lys_module *)0x0;
    }
    iVar2 = ly_strequal_(*(char **)(*(long *)(module->imp[1].rev + lVar5 + -0x10) + 0xa8),ns);
    lVar1 = lVar5 + 0x38;
  } while (iVar2 == 0);
  pplVar3 = (lys_node **)(module->imp[1].rev + lVar5 + -0x10);
LAB_00151d9c:
  return (lys_module *)*pplVar3;
}

Assistant:

const struct lys_module *
lys_get_import_module_ns(const struct lys_module *module, const char *ns)
{
    int i;

    assert(module && ns);

    if (module->type) {
        /* the module is actually submodule and to get the namespace, we need the main module */
        if (ly_strequal(((struct lys_submodule *)module)->belongsto->ns, ns, 0)) {
            return ((struct lys_submodule *)module)->belongsto;
        }
    } else {
        /* modul's own namespace */
        if (ly_strequal(module->ns, ns, 0)) {
            return module;
        }
    }

    /* imported modules */
    for (i = 0; i < module->imp_size; ++i) {
        if (ly_strequal(module->imp[i].module->ns, ns, 0)) {
            return module->imp[i].module;
        }
    }

    return NULL;
}